

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_entropyCompressSeqStore_internal
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,void *entropyWorkspace,size_t entropyWkspSize,int bmi2)

{
  ZSTD_strategy strategy_00;
  ZSTD_strategy strategy_01;
  seqDef *sequences_00;
  BYTE *ofCodeTable_00;
  BYTE *llCodeTable_00;
  BYTE *mlCodeTable_00;
  BYTE *pBVar1;
  uint uVar2;
  int disableLiteralCompression;
  uint uVar3;
  ulong nbSeq_00;
  BYTE *dstEnd;
  size_t sVar4;
  char *pcVar5;
  BYTE *pBVar6;
  uint uVar7;
  size_t err_code_2;
  size_t bitstreamSize;
  size_t err_code_1;
  undefined1 local_128 [16];
  size_t local_118;
  char *local_110;
  BYTE *seqHead;
  ZSTD_symbolEncodingTypeStats_t stats;
  size_t err_code;
  size_t cSize;
  size_t litSize;
  BYTE *literals;
  size_t lastCountSize;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *mlCodeTable;
  BYTE *llCodeTable;
  BYTE *ofCodeTable;
  size_t nbSeq;
  seqDef *sequences;
  FSE_CTable *CTable_MatchLength;
  FSE_CTable *CTable_OffsetBits;
  FSE_CTable *CTable_LitLength;
  uint *count;
  ZSTD_strategy strategy;
  int longOffsets;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx_params *cctxParams_local;
  ZSTD_entropyCTables_t *nextEntropy_local;
  ZSTD_entropyCTables_t *prevEntropy_local;
  seqStore_t *seqStorePtr_local;
  
  uVar3 = (cctxParams->cParams).windowLog;
  uVar2 = MEM_32bits();
  uVar7 = 0x39;
  if (uVar2 != 0) {
    uVar7 = 0x19;
  }
  strategy_00 = (cctxParams->cParams).strategy;
  sequences_00 = seqStorePtr->sequencesStart;
  nbSeq_00 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart >> 3;
  ofCodeTable_00 = seqStorePtr->ofCode;
  llCodeTable_00 = seqStorePtr->llCode;
  mlCodeTable_00 = seqStorePtr->mlCode;
  dstEnd = (BYTE *)((long)dst + dstCapacity);
  pBVar6 = seqStorePtr->litStart;
  pBVar1 = seqStorePtr->lit;
  strategy_01 = (cctxParams->cParams).strategy;
  disableLiteralCompression = ZSTD_disableLiteralsCompression(cctxParams);
  sVar4 = ZSTD_compressLiterals
                    (&prevEntropy->huf,&nextEntropy->huf,strategy_01,disableLiteralCompression,dst,
                     dstCapacity,pBVar6,(long)pBVar1 - (long)pBVar6,
                     (void *)((long)entropyWorkspace + 0xd4),entropyWkspSize - 0xd4,bmi2);
  stats.lastCountSize = sVar4;
  uVar2 = ERR_isError(sVar4);
  if (uVar2 == 0) {
    pcVar5 = (char *)(sVar4 + (long)dst);
    if ((long)dstEnd - (long)pcVar5 < 4) {
      seqStorePtr_local = (seqStore_t *)0xffffffffffffffba;
    }
    else {
      if (nbSeq_00 < 0x80) {
        lastCountSize = (size_t)(pcVar5 + 1);
        *pcVar5 = (char)nbSeq_00;
      }
      else if (nbSeq_00 < 0x7f00) {
        *pcVar5 = (char)(nbSeq_00 >> 8) + -0x80;
        pcVar5[1] = (char)nbSeq_00;
        lastCountSize = (size_t)(pcVar5 + 2);
      }
      else {
        *pcVar5 = -1;
        MEM_writeLE16(pcVar5 + 1,(short)nbSeq_00 + 0x8100);
        lastCountSize = (size_t)(pcVar5 + 3);
      }
      if (nbSeq_00 == 0) {
        memcpy(&nextEntropy->fse,&prevEntropy->fse,0xde0);
        seqStorePtr_local = (seqStore_t *)(lastCountSize - (long)dst);
      }
      else {
        local_110 = (char *)lastCountSize;
        ZSTD_buildSequencesStatistics
                  ((ZSTD_symbolEncodingTypeStats_t *)&err_code_1,seqStorePtr,nbSeq_00,
                   &prevEntropy->fse,&nextEntropy->fse,(BYTE *)(lastCountSize + 1),dstEnd,
                   strategy_00,(uint *)entropyWorkspace,(void *)((long)entropyWorkspace + 0xd4),
                   entropyWkspSize - 0xd4);
        seqHead = (BYTE *)err_code_1;
        stats.LLtype = local_128._0_4_;
        stats.Offtype = local_128._4_4_;
        stats._8_8_ = local_128._8_8_;
        stats.size = local_118;
        uVar2 = ERR_isError(local_128._8_8_);
        sVar4 = stats.size;
        if (uVar2 == 0) {
          *local_110 = (char)((int)seqHead << 6) + (char)(seqHead._4_4_ << 4) +
                       (char)(stats.LLtype << 2);
          pBVar6 = (BYTE *)(lastCountSize + 1) + stats._8_8_;
          seqStorePtr_local =
               (seqStore_t *)
               ZSTD_encodeSequences
                         (pBVar6,(long)dstEnd - (long)pBVar6,(nextEntropy->fse).matchlengthCTable,
                          mlCodeTable_00,(nextEntropy->fse).offcodeCTable,ofCodeTable_00,
                          (nextEntropy->fse).litlengthCTable,llCodeTable_00,sequences_00,nbSeq_00,
                          (uint)(uVar7 < uVar3),bmi2);
          uVar3 = ERR_isError((size_t)seqStorePtr_local);
          if (uVar3 == 0) {
            if ((sVar4 == 0) || (3 < (long)&seqStorePtr_local->sequencesStart + sVar4)) {
              seqStorePtr_local =
                   (seqStore_t *)(pBVar6 + ((long)&seqStorePtr_local->sequencesStart - (long)dst));
            }
            else {
              seqStorePtr_local = (seqStore_t *)0x0;
            }
          }
        }
        else {
          seqStorePtr_local = (seqStore_t *)local_128._8_8_;
        }
      }
    }
  }
  else {
    seqStorePtr_local = (seqStore_t *)stats.lastCountSize;
  }
  return (size_t)seqStorePtr_local;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore_internal(seqStore_t* seqStorePtr,
                          const ZSTD_entropyCTables_t* prevEntropy,
                                ZSTD_entropyCTables_t* nextEntropy,
                          const ZSTD_CCtx_params* cctxParams,
                                void* dst, size_t dstCapacity,
                                void* entropyWorkspace, size_t entropyWkspSize,
                          const int bmi2)
{
    const int longOffsets = cctxParams->cParams.windowLog > STREAM_ACCUMULATOR_MIN;
    ZSTD_strategy const strategy = cctxParams->cParams.strategy;
    unsigned* count = (unsigned*)entropyWorkspace;
    FSE_CTable* CTable_LitLength = nextEntropy->fse.litlengthCTable;
    FSE_CTable* CTable_OffsetBits = nextEntropy->fse.offcodeCTable;
    FSE_CTable* CTable_MatchLength = nextEntropy->fse.matchlengthCTable;
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    const size_t nbSeq = seqStorePtr->sequences - seqStorePtr->sequencesStart;
    const BYTE* const ofCodeTable = seqStorePtr->ofCode;
    const BYTE* const llCodeTable = seqStorePtr->llCode;
    const BYTE* const mlCodeTable = seqStorePtr->mlCode;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstCapacity;
    BYTE* op = ostart;
    size_t lastCountSize;

    entropyWorkspace = count + (MaxSeq + 1);
    entropyWkspSize -= (MaxSeq + 1) * sizeof(*count);

    DEBUGLOG(4, "ZSTD_entropyCompressSeqStore_internal (nbSeq=%zu)", nbSeq);
    ZSTD_STATIC_ASSERT(HUF_WORKSPACE_SIZE >= (1<<MAX(MLFSELog,LLFSELog)));
    assert(entropyWkspSize >= HUF_WORKSPACE_SIZE);

    /* Compress literals */
    {   const BYTE* const literals = seqStorePtr->litStart;
        size_t const litSize = (size_t)(seqStorePtr->lit - literals);
        size_t const cSize = ZSTD_compressLiterals(
                                    &prevEntropy->huf, &nextEntropy->huf,
                                    cctxParams->cParams.strategy,
                                    ZSTD_disableLiteralsCompression(cctxParams),
                                    op, dstCapacity,
                                    literals, litSize,
                                    entropyWorkspace, entropyWkspSize,
                                    bmi2);
        FORWARD_IF_ERROR(cSize, "ZSTD_compressLiterals failed");
        assert(cSize <= dstCapacity);
        op += cSize;
    }

    /* Sequences Header */
    RETURN_ERROR_IF((oend-op) < 3 /*max nbSeq Size*/ + 1 /*seqHead*/,
                    dstSize_tooSmall, "Can't fit seq hdr in output buf!");
    if (nbSeq < 128) {
        *op++ = (BYTE)nbSeq;
    } else if (nbSeq < LONGNBSEQ) {
        op[0] = (BYTE)((nbSeq>>8) + 0x80);
        op[1] = (BYTE)nbSeq;
        op+=2;
    } else {
        op[0]=0xFF;
        MEM_writeLE16(op+1, (U16)(nbSeq - LONGNBSEQ));
        op+=3;
    }
    assert(op <= oend);
    if (nbSeq==0) {
        /* Copy the old tables over as if we repeated them */
        ZSTD_memcpy(&nextEntropy->fse, &prevEntropy->fse, sizeof(prevEntropy->fse));
        return (size_t)(op - ostart);
    }
    {
        ZSTD_symbolEncodingTypeStats_t stats;
        BYTE* seqHead = op++;
        /* build stats for sequences */
        stats = ZSTD_buildSequencesStatistics(seqStorePtr, nbSeq,
                                             &prevEntropy->fse, &nextEntropy->fse,
                                              op, oend,
                                              strategy, count,
                                              entropyWorkspace, entropyWkspSize);
        FORWARD_IF_ERROR(stats.size, "ZSTD_buildSequencesStatistics failed!");
        *seqHead = (BYTE)((stats.LLtype<<6) + (stats.Offtype<<4) + (stats.MLtype<<2));
        lastCountSize = stats.lastCountSize;
        op += stats.size;
    }

    {   size_t const bitstreamSize = ZSTD_encodeSequences(
                                        op, (size_t)(oend - op),
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq,
                                        longOffsets, bmi2);
        FORWARD_IF_ERROR(bitstreamSize, "ZSTD_encodeSequences failed");
        op += bitstreamSize;
        assert(op <= oend);
        /* zstd versions <= 1.3.4 mistakenly report corruption when
         * FSE_readNCount() receives a buffer < 4 bytes.
         * Fixed by https://github.com/facebook/zstd/pull/1146.
         * This can happen when the last set_compressed table present is 2
         * bytes and the bitstream is only one byte.
         * In this exceedingly rare case, we will simply emit an uncompressed
         * block, since it isn't worth optimizing.
         */
        if (lastCountSize && (lastCountSize + bitstreamSize) < 4) {
            /* lastCountSize >= 2 && bitstreamSize > 0 ==> lastCountSize == 3 */
            assert(lastCountSize + bitstreamSize == 3);
            DEBUGLOG(5, "Avoiding bug in zstd decoder in versions <= 1.3.4 by "
                        "emitting an uncompressed block.");
            return 0;
        }
    }

    DEBUGLOG(5, "compressed block size : %u", (unsigned)(op - ostart));
    return (size_t)(op - ostart);
}